

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O0

StringSet * __thiscall
OSTEI_VRR_Algorithm_Base::GenerateVarReq_abi_cxx11_
          (OSTEI_VRR_Algorithm_Base *this,QAM *am,RRStepType rrstep)

{
  bool bVar1;
  int in_ECX;
  StringSet *in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  QAMList amreq;
  StringSet *req;
  undefined1 in_stack_000006bb;
  RRStepType in_stack_000006bc;
  QAM *in_stack_000006c0;
  OSTEI_VRR_Algorithm_Base *in_stack_000006c8;
  undefined7 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff99f;
  QAM *in_stack_fffffffffffff9a0;
  uint in_stack_fffffffffffff9b0;
  undefined1 in_stack_fffffffffffff9b4;
  undefined1 in_stack_fffffffffffff9b5;
  undefined1 in_stack_fffffffffffff9b6;
  undefined1 in_stack_fffffffffffff9b7;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff9b8;
  allocator *in_stack_fffffffffffff9c0;
  bool local_61b;
  bool local_5bb;
  bool local_58b;
  allocator local_501;
  string local_500 [39];
  byte local_4d9;
  _Base_ptr local_478;
  undefined1 local_470;
  allocator local_461;
  string local_460 [32];
  _Base_ptr local_440;
  undefined1 local_438;
  allocator local_429;
  string local_428 [39];
  byte local_401;
  _Base_ptr local_3a0;
  undefined1 local_398;
  allocator local_389;
  string local_388 [32];
  _Base_ptr local_368;
  undefined1 local_360;
  allocator local_351;
  string local_350 [32];
  _Base_ptr local_330;
  undefined1 local_328;
  allocator local_319;
  string local_318 [80];
  _Base_ptr local_2c8;
  undefined1 local_2c0;
  allocator local_2b1;
  string local_2b0 [39];
  byte local_289;
  _Base_ptr local_228;
  undefined1 local_220;
  allocator local_211;
  string local_210 [32];
  _Base_ptr local_1f0;
  undefined1 local_1e8;
  allocator local_1d9;
  string local_1d8 [39];
  byte local_1b1;
  _Base_ptr local_150;
  undefined1 local_148;
  allocator local_139;
  string local_138 [32];
  _Base_ptr local_118;
  undefined1 local_110;
  allocator local_101;
  string local_100 [32];
  _Base_ptr local_e0;
  undefined1 local_d8;
  allocator local_c9;
  string local_c8 [83];
  undefined1 local_75;
  vector<QAM,_std::allocator<QAM>_> local_38;
  int local_1c;
  
  local_1c = in_ECX;
  QAM::QAM(in_stack_fffffffffffff9a0,
           (QAM *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
  GenerateAMReq(in_stack_000006c8,in_stack_000006c0,in_stack_000006bc,(bool)in_stack_000006bb);
  QAM::~QAM((QAM *)0x12070a);
  local_75 = 0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x12071f);
  if ((local_1c == 0) || (local_1c == 1)) {
    std::vector<QAM,_std::allocator<QAM>_>::operator[](&local_38,0);
    QAM::QAM(in_stack_fffffffffffff9a0,
             (QAM *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
    bVar1 = ValidQAM(in_stack_fffffffffffff9a0);
    QAM::~QAM((QAM *)0x12077d);
    if (bVar1) {
      if (local_1c == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c8,"P_PA",&local_c9);
        pVar2 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff9c0,
                         (value_type *)in_stack_fffffffffffff9b8._M_node);
        local_e0 = (_Base_ptr)pVar2.first._M_node;
        local_d8 = pVar2.second;
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_100,"P_PB",&local_101);
        pVar2 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff9c0,
                         (value_type *)in_stack_fffffffffffff9b8._M_node);
        local_118 = (_Base_ptr)pVar2.first._M_node;
        local_110 = pVar2.second;
        std::__cxx11::string::~string(local_100);
        std::allocator<char>::~allocator((allocator<char> *)&local_101);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"aop_PQ",&local_139);
      pVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff9c0,(value_type *)in_stack_fffffffffffff9b8._M_node)
      ;
      local_150 = (_Base_ptr)pVar2.first._M_node;
      local_148 = pVar2.second;
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
    }
    std::vector<QAM,_std::allocator<QAM>_>::operator[](&local_38,1);
    local_1b1 = 0;
    QAM::QAM(in_stack_fffffffffffff9a0,
             (QAM *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
    bVar1 = ValidQAM(in_stack_fffffffffffff9a0);
    local_58b = true;
    if (!bVar1) {
      std::vector<QAM,_std::allocator<QAM>_>::operator[](&local_38,2);
      QAM::QAM(in_stack_fffffffffffff9a0,
               (QAM *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
      local_1b1 = 1;
      local_58b = ValidQAM(in_stack_fffffffffffff9a0);
    }
    if ((local_1b1 & 1) != 0) {
      QAM::~QAM((QAM *)0x120b69);
    }
    QAM::~QAM((QAM *)0x120b76);
    if (local_58b != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"one_over_2p",&local_1d9);
      pVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff9c0,(value_type *)in_stack_fffffffffffff9b8._M_node)
      ;
      local_1f0 = (_Base_ptr)pVar2.first._M_node;
      local_1e8 = pVar2.second;
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"a_over_p",&local_211);
      pVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff9c0,(value_type *)in_stack_fffffffffffff9b8._M_node)
      ;
      local_228 = (_Base_ptr)pVar2.first._M_node;
      local_220 = pVar2.second;
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
    }
    std::vector<QAM,_std::allocator<QAM>_>::operator[](&local_38,3);
    local_289 = 0;
    QAM::QAM(in_stack_fffffffffffff9a0,
             (QAM *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
    bVar1 = ValidQAM(in_stack_fffffffffffff9a0);
    local_5bb = true;
    if (!bVar1) {
      std::vector<QAM,_std::allocator<QAM>_>::operator[](&local_38,4);
      QAM::QAM(in_stack_fffffffffffff9a0,
               (QAM *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
      local_289 = 1;
      local_5bb = ValidQAM(in_stack_fffffffffffff9a0);
    }
    if ((local_289 & 1) != 0) {
      QAM::~QAM((QAM *)0x120e68);
    }
    QAM::~QAM((QAM *)0x120e75);
    if (local_5bb != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2b0,"one_over_2pq",&local_2b1);
      pVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff9c0,(value_type *)in_stack_fffffffffffff9b8._M_node)
      ;
      local_2c8 = (_Base_ptr)pVar2.first._M_node;
      local_2c0 = pVar2.second;
      std::__cxx11::string::~string(local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
    }
  }
  else {
    std::vector<QAM,_std::allocator<QAM>_>::operator[](&local_38,0);
    QAM::QAM(in_stack_fffffffffffff9a0,
             (QAM *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
    bVar1 = ValidQAM(in_stack_fffffffffffff9a0);
    QAM::~QAM((QAM *)0x121006);
    if (bVar1) {
      if (local_1c == 2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_318,"Q_PA",&local_319);
        pVar2 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff9c0,
                         (value_type *)in_stack_fffffffffffff9b8._M_node);
        local_330 = (_Base_ptr)pVar2.first._M_node;
        local_328 = pVar2.second;
        std::__cxx11::string::~string(local_318);
        std::allocator<char>::~allocator((allocator<char> *)&local_319);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_350,"Q_PB",&local_351);
        pVar2 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffff9c0,
                         (value_type *)in_stack_fffffffffffff9b8._M_node);
        local_368 = (_Base_ptr)pVar2.first._M_node;
        local_360 = pVar2.second;
        std::__cxx11::string::~string(local_350);
        std::allocator<char>::~allocator((allocator<char> *)&local_351);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_388,"aoq_PQ",&local_389);
      pVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff9c0,(value_type *)in_stack_fffffffffffff9b8._M_node)
      ;
      local_3a0 = (_Base_ptr)pVar2.first._M_node;
      local_398 = pVar2.second;
      std::__cxx11::string::~string(local_388);
      std::allocator<char>::~allocator((allocator<char> *)&local_389);
    }
    std::vector<QAM,_std::allocator<QAM>_>::operator[](&local_38,1);
    local_401 = 0;
    QAM::QAM(in_stack_fffffffffffff9a0,
             (QAM *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
    bVar1 = ValidQAM(in_stack_fffffffffffff9a0);
    local_61b = true;
    if (!bVar1) {
      std::vector<QAM,_std::allocator<QAM>_>::operator[](&local_38,2);
      QAM::QAM(in_stack_fffffffffffff9a0,
               (QAM *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
      local_401 = 1;
      local_61b = ValidQAM(in_stack_fffffffffffff9a0);
    }
    if ((local_401 & 1) != 0) {
      QAM::~QAM((QAM *)0x121371);
    }
    QAM::~QAM((QAM *)0x12137e);
    if (local_61b != false) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_428,"one_over_2q",&local_429);
      pVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff9c0,(value_type *)in_stack_fffffffffffff9b8._M_node)
      ;
      local_440 = (_Base_ptr)pVar2.first._M_node;
      local_438 = pVar2.second;
      std::__cxx11::string::~string(local_428);
      std::allocator<char>::~allocator((allocator<char> *)&local_429);
      in_stack_fffffffffffff9c0 = &local_461;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_460,"a_over_q",in_stack_fffffffffffff9c0);
      pVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff9c0,(value_type *)in_stack_fffffffffffff9b8._M_node)
      ;
      in_stack_fffffffffffff9b8 = pVar2.first._M_node;
      in_stack_fffffffffffff9b7 = pVar2.second;
      local_478 = in_stack_fffffffffffff9b8._M_node;
      local_470 = in_stack_fffffffffffff9b7;
      std::__cxx11::string::~string(local_460);
      std::allocator<char>::~allocator((allocator<char> *)&local_461);
    }
    std::vector<QAM,_std::allocator<QAM>_>::operator[](&local_38,3);
    local_4d9 = 0;
    QAM::QAM(in_stack_fffffffffffff9a0,
             (QAM *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
    in_stack_fffffffffffff9b6 = ValidQAM(in_stack_fffffffffffff9a0);
    in_stack_fffffffffffff9b5 = true;
    if (!(bool)in_stack_fffffffffffff9b6) {
      std::vector<QAM,_std::allocator<QAM>_>::operator[](&local_38,4);
      QAM::QAM(in_stack_fffffffffffff9a0,
               (QAM *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998));
      local_4d9 = 1;
      in_stack_fffffffffffff9b4 = ValidQAM(in_stack_fffffffffffff9a0);
      in_stack_fffffffffffff9b5 = in_stack_fffffffffffff9b4;
    }
    in_stack_fffffffffffff9b0 = CONCAT13(in_stack_fffffffffffff9b5,(int3)in_stack_fffffffffffff9b0);
    if ((local_4d9 & 1) != 0) {
      QAM::~QAM((QAM *)0x121631);
    }
    QAM::~QAM((QAM *)0x12163e);
    if ((in_stack_fffffffffffff9b0 & 0x1000000) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_500,"one_over_2pq",&local_501);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff9c0,(value_type *)in_stack_fffffffffffff9b8._M_node);
      std::__cxx11::string::~string(local_500);
      std::allocator<char>::~allocator((allocator<char> *)&local_501);
    }
  }
  local_75 = 1;
  std::vector<QAM,_std::allocator<QAM>_>::~vector
            ((vector<QAM,_std::allocator<QAM>_> *)
             CONCAT17(in_stack_fffffffffffff9b7,
                      CONCAT16(in_stack_fffffffffffff9b6,
                               CONCAT15(in_stack_fffffffffffff9b5,
                                        CONCAT14(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0
                                                )))));
  return in_RDI;
}

Assistant:

StringSet OSTEI_VRR_Algorithm_Base::GenerateVarReq(QAM am, RRStepType rrstep) const
{
    auto amreq = GenerateAMReq(am, rrstep, true);

    StringSet req;


    if(rrstep == RRStepType::I || rrstep == RRStepType::J)
    {
        if(ValidQAM(amreq[0]))
        {
            if(rrstep == RRStepType::I)
                req.insert("P_PA");
            else
                req.insert("P_PB");

            req.insert("aop_PQ");
        }

        if(ValidQAM(amreq[1]) || ValidQAM(amreq[2]))
        {
            req.insert("one_over_2p");
            req.insert("a_over_p");
        }

        if(ValidQAM(amreq[3]) || ValidQAM(amreq[4]))
            req.insert("one_over_2pq");
    }
    else
    {
        if(ValidQAM(amreq[0]))
        {
            if(rrstep == RRStepType::K)
                req.insert("Q_PA");
            else
                req.insert("Q_PB");

            req.insert("aoq_PQ");
        }

        if(ValidQAM(amreq[1]) || ValidQAM(amreq[2]))
        {
            req.insert("one_over_2q");
            req.insert("a_over_q");
        }

        if(ValidQAM(amreq[3]) || ValidQAM(amreq[4]))
            req.insert("one_over_2pq");
    }

    return req;

}